

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void plot_interior_tiles(tgestate_t *state)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  tilerow_t *ptVar5;
  byte *pbVar6;
  int iVar7;
  tilerow_t *ptVar8;
  
  iVar2 = state->columns;
  iVar3 = state->rows + -1;
  ptVar5 = state->window_buf;
  pbVar6 = state->tile_buf;
  iVar7 = iVar2;
  do {
    do {
      bVar1 = *pbVar6;
      lVar4 = 0;
      ptVar8 = ptVar5;
      do {
        *ptVar8 = interior_tiles[bVar1].row[lVar4];
        ptVar8 = ptVar8 + iVar2;
        lVar4 = lVar4 + 1;
      } while ((int)lVar4 != 8);
      pbVar6 = pbVar6 + 1;
      ptVar5 = ptVar5 + 1;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    ptVar5 = ptVar5 + (long)iVar2 * 7;
    iVar3 = iVar3 + -1;
    iVar7 = iVar2;
  } while (iVar3 != 0);
  return;
}

Assistant:

void plot_interior_tiles(tgestate_t *state)
{
  int                        rows;          /* added */
  int                        columns;       /* added */
  uint8_t                   *window_buf;    /* was HL */
  const interiortileindex_t *tiles_buf;     /* was DE */
  int                        rowcounter;    /* was C */
  int                        columncounter; /* was B */
  int                        iters;         /* was B */
  int                        stride;        /* was C */

  assert(state != NULL);

  rows       = state->rows - 1; // 16
  columns    = state->columns; // 24

  window_buf = state->window_buf;
  tiles_buf  = state->tile_buf; // note: type is coerced

  rowcounter = rows;
  do
  {
    columncounter = columns;
    do
    {
      const tilerow_t *tile_data;   /* was HL */
      uint8_t         *window_buf2; /* was DE */

      ASSERT_TILE_BUF_PTR_VALID(tiles_buf);

      tile_data = &interior_tiles[*tiles_buf].row[0];

      window_buf2 = window_buf;

      iters  = 8;
      stride = columns;
      do
      {
        ASSERT_WINDOW_BUF_PTR_VALID(window_buf2, 0);
        ASSERT_INTERIOR_TILES_VALID(tile_data);

        *window_buf2 = *tile_data++;
        window_buf2 += stride;
      }
      while (--iters);

      tiles_buf++;
      window_buf++; // move to next character position
    }
    while (--columncounter);
    window_buf += 7 * columns; // move to next row
  }
  while (--rowcounter);
}